

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

int64_t anon_unknown.dwarf_41b5d::GetSourceSampleOffset
                  (ALsource *Source,ALCcontext *context,nanoseconds *clocktime)

{
  uint uVar1;
  ALuint AVar2;
  ALCdevice *pAVar3;
  nanoseconds nVar4;
  Voice *pVVar5;
  uint64_t b;
  rep *in_RDX;
  long in_RSI;
  long in_RDI;
  BufferlistItem *BufferList;
  Voice *voice;
  ALuint refcount;
  uint64_t readPos;
  BufferlistItem *Current;
  ALCdevice *device;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined8 in_stack_ffffffffffffff10;
  memory_order __m;
  uint in_stack_ffffffffffffff18;
  ALuint in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  ALCcontext *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  __pointer_type local_a8;
  ulong local_88;
  __pointer_type local_80;
  uint64_t local_58;
  
  pAVar3 = al::intrusive_ptr<ALCdevice>::get((intrusive_ptr<ALCdevice> *)(in_RSI + 0x200));
  local_80 = (__pointer_type)0x0;
  local_88 = 0;
  do {
    AVar2 = ALCdevice::waitForMix
                      ((ALCdevice *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    nVar4 = GetDeviceClockTime((ALCdevice *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    *in_RDX = nVar4.__r;
    pVVar5 = GetSourceVoice((ALsource *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff38);
    __m = (memory_order)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    if (pVVar5 != (Voice *)0x0) {
      local_80 = std::atomic<BufferlistItem_*>::load
                           ((atomic<BufferlistItem_*> *)
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),__m);
      std::operator&(memory_order_relaxed,__memory_order_mask);
      uVar1 = (pVVar5->mPosition).super___atomic_base<unsigned_int>._M_i;
      in_stack_ffffffffffffff38 = (ALCcontext *)&pVVar5->mPositionFrac;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      in_stack_ffffffffffffff44 = 0;
      local_88 = (ulong)((__atomic_base<unsigned_int> *)
                        &in_stack_ffffffffffffff38->super_intrusive_ref<ALCcontext>)->_M_i << 0x14 |
                 (ulong)uVar1 << 0x20;
    }
    std::operator&(memory_order_relaxed,__memory_order_mask);
    in_stack_ffffffffffffff2c = 0;
    in_stack_ffffffffffffff1c = AVar2;
  } while (AVar2 != (pAVar3->MixCount).super___atomic_base<unsigned_int>._M_i);
  if (pVVar5 == (Voice *)0x0) {
    local_58 = 0;
  }
  else {
    local_a8 = *(__pointer_type *)(in_RDI + 0x180);
    while( true ) {
      uVar1 = in_stack_ffffffffffffff18 & 0xffffff;
      if (local_a8 != (__pointer_type)0x0) {
        uVar1 = CONCAT13(local_a8 != local_80,(int3)in_stack_ffffffffffffff18);
      }
      in_stack_ffffffffffffff18 = uVar1;
      if ((char)(in_stack_ffffffffffffff18 >> 0x18) == '\0') break;
      local_88 = ((ulong)local_a8->mSampleLen << 0x20) + local_88;
      local_a8 = std::atomic<BufferlistItem_*>::load
                           ((atomic<BufferlistItem_*> *)CONCAT44(AVar2,in_stack_ffffffffffffff18),
                            __m);
    }
    b = operator____u64(0x7fffffffffffffff);
    local_58 = minu64(local_88,b);
  }
  return local_58;
}

Assistant:

int64_t GetSourceSampleOffset(ALsource *Source, ALCcontext *context, nanoseconds *clocktime)
{
    ALCdevice *device{context->mDevice.get()};
    const BufferlistItem *Current{};
    uint64_t readPos{};
    ALuint refcount;
    Voice *voice;

    do {
        refcount = device->waitForMix();
        *clocktime = GetDeviceClockTime(device);
        voice = GetSourceVoice(Source, context);
        if(voice)
        {
            Current = voice->mCurrentBuffer.load(std::memory_order_relaxed);

            readPos  = uint64_t{voice->mPosition.load(std::memory_order_relaxed)} << 32;
            readPos |= uint64_t{voice->mPositionFrac.load(std::memory_order_relaxed)} <<
                       (32-MixerFracBits);
        }
        std::atomic_thread_fence(std::memory_order_acquire);
    } while(refcount != device->MixCount.load(std::memory_order_relaxed));

    if(!voice)
        return 0;

    const BufferlistItem *BufferList{Source->queue};
    while(BufferList && BufferList != Current)
    {
        readPos += uint64_t{BufferList->mSampleLen} << 32;
        BufferList = BufferList->mNext.load(std::memory_order_relaxed);
    }
    return static_cast<int64_t>(minu64(readPos, 0x7fffffffffffffff_u64));
}